

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::ScaleRatioFromValueT<unsigned_long_long,long_long,double>
                (ImGuiDataType data_type,unsigned_long_long v,unsigned_long_long v_min,
                unsigned_long_long v_max,bool is_logarithmic,float logarithmic_zero_epsilon,
                float zero_deadzone_halfsize)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  long lVar3;
  unsigned_long_long uVar4;
  ulong uVar5;
  unsigned_long_long uVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  undefined1 in_register_00001204 [60];
  undefined1 auVar10 [16];
  undefined1 in_ZMM2 [64];
  undefined1 in_ZMM3 [64];
  undefined1 in_XMM4 [16];
  
  fVar7 = 0.0;
  lVar3 = v_max - v_min;
  if (lVar3 != 0) {
    uVar5 = v_max;
    if (v_max < v_min) {
      uVar5 = v_min;
    }
    uVar6 = v_max;
    if (v_max >= v_min && lVar3 != 0) {
      uVar6 = v_min;
    }
    if (v < uVar5) {
      uVar5 = v;
    }
    if (v < uVar6) {
      uVar5 = uVar6;
    }
    if (is_logarithmic) {
      uVar6 = v_min;
      if (v_max < v_min) {
        uVar6 = v_max;
      }
      uVar4 = v_min;
      if (v_min < v_max) {
        uVar4 = v_max;
      }
      auVar1 = vcvtusi2sd_avx512f(in_ZMM2._0_16_,uVar6);
      auVar10._0_8_ = (double)logarithmic_zero_epsilon;
      auVar10._8_8_ = in_register_00001204._4_8_;
      auVar2 = vcvtusi2sd_avx512f(in_ZMM3._0_16_,uVar5);
      auVar1 = vmaxsd_avx(auVar10,auVar1);
      fVar7 = 0.0;
      dVar9 = auVar1._0_8_;
      dVar8 = auVar2._0_8_;
      if (dVar9 < dVar8) {
        auVar1 = vcvtusi2sd_avx512f(in_XMM4,uVar4);
        auVar1 = vmaxsd_avx(auVar10,auVar1);
        if (auVar1._0_8_ <= dVar8) {
          fVar7 = 1.0;
        }
        else {
          dVar8 = log(dVar8 / dVar9);
          dVar9 = log(auVar1._0_8_ / dVar9);
          fVar7 = (float)(dVar8 / dVar9);
        }
      }
      fVar7 = (float)((uint)(v_max < v_min) * (int)(1.0 - fVar7) +
                     (uint)(v_max >= v_min) * (int)fVar7);
    }
    else {
      fVar7 = (float)((double)(long)(uVar5 - v_min) / (double)lVar3);
    }
  }
  return fVar7;
}

Assistant:

float ImGui::ScaleRatioFromValueT(ImGuiDataType data_type, TYPE v, TYPE v_min, TYPE v_max, bool is_logarithmic, float logarithmic_zero_epsilon, float zero_deadzone_halfsize)
{
    if (v_min == v_max)
        return 0.0f;
    IM_UNUSED(data_type);

    const TYPE v_clamped = (v_min < v_max) ? ImClamp(v, v_min, v_max) : ImClamp(v, v_max, v_min);
    if (is_logarithmic)
    {
        bool flipped = v_max < v_min;

        if (flipped) // Handle the case where the range is backwards
            ImSwap(v_min, v_max);

        // Fudge min/max to avoid getting close to log(0)
        FLOATTYPE v_min_fudged = (ImAbs((FLOATTYPE)v_min) < logarithmic_zero_epsilon) ? ((v_min < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_min;
        FLOATTYPE v_max_fudged = (ImAbs((FLOATTYPE)v_max) < logarithmic_zero_epsilon) ? ((v_max < 0.0f) ? -logarithmic_zero_epsilon : logarithmic_zero_epsilon) : (FLOATTYPE)v_max;

        // Awkward special cases - we need ranges of the form (-100 .. 0) to convert to (-100 .. -epsilon), not (-100 .. epsilon)
        if ((v_min == 0.0f) && (v_max < 0.0f))
            v_min_fudged = -logarithmic_zero_epsilon;
        else if ((v_max == 0.0f) && (v_min < 0.0f))
            v_max_fudged = -logarithmic_zero_epsilon;

        float result;

        if (v_clamped <= v_min_fudged)
            result = 0.0f; // Workaround for values that are in-range but below our fudge
        else if (v_clamped >= v_max_fudged)
            result = 1.0f; // Workaround for values that are in-range but above our fudge
        else if ((v_min * v_max) < 0.0f) // Range crosses zero, so split into two portions
        {
            float zero_point_center = (-(float)v_min) / ((float)v_max - (float)v_min); // The zero point in parametric space.  There's an argument we should take the logarithmic nature into account when calculating this, but for now this should do (and the most common case of a symmetrical range works fine)
            float zero_point_snap_L = zero_point_center - zero_deadzone_halfsize;
            float zero_point_snap_R = zero_point_center + zero_deadzone_halfsize;
            if (v == 0.0f)
                result = zero_point_center; // Special case for exactly zero
            else if (v < 0.0f)
                result = (1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(-v_min_fudged / logarithmic_zero_epsilon))) * zero_point_snap_L;
            else
                result = zero_point_snap_R + ((float)(ImLog((FLOATTYPE)v_clamped / logarithmic_zero_epsilon) / ImLog(v_max_fudged / logarithmic_zero_epsilon)) * (1.0f - zero_point_snap_R));
        }
        else if ((v_min < 0.0f) || (v_max < 0.0f)) // Entirely negative slider
            result = 1.0f - (float)(ImLog(-(FLOATTYPE)v_clamped / -v_max_fudged) / ImLog(-v_min_fudged / -v_max_fudged));
        else
            result = (float)(ImLog((FLOATTYPE)v_clamped / v_min_fudged) / ImLog(v_max_fudged / v_min_fudged));

        return flipped ? (1.0f - result) : result;
    }

    // Linear slider
    return (float)((FLOATTYPE)(SIGNEDTYPE)(v_clamped - v_min) / (FLOATTYPE)(SIGNEDTYPE)(v_max - v_min));
}